

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

CTypeID cp_decl_struct(CPState *cp,CPDecl *sdecl,CTInfo sinfo)

{
  ushort uVar1;
  CTypeID CVar2;
  CPscl CVar3;
  CTypeID ctypeid;
  CTypeID CVar4;
  CTInfo CVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  CType *pCVar9;
  CTSize CVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  CType *pCVar14;
  int *piVar15;
  CTypeID CVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  CType *ct;
  uint local_6f8;
  CType *local_6f0;
  ulong local_6e8;
  uint local_6dc;
  uint local_6d8;
  uint local_6d4;
  long local_6d0;
  CType *local_6c8;
  CTState *local_6c0;
  ulong local_6b8;
  CPDecl local_6b0;
  
  CVar2 = cp_struct_name(cp,sdecl,sinfo);
  if (cp->tok == 0x7b) {
    cp_next(cp);
    CVar4 = CVar2;
    if (cp->tok != 0x7d) {
      bVar19 = false;
LAB_0013baab:
      CVar3 = cp_decl_spec(cp,&local_6b0,0x20000);
      local_6b0.mode = 4;
      CVar16 = CVar4;
      if (CVar3 == 0) {
        local_6b0.mode = 0xe;
      }
      do {
        if (bVar19) {
          cp_err_token(cp,0x7d);
        }
        local_6b0.bits = 0xffffffff;
        cp_declarator(cp,&local_6b0);
        ctypeid = cp_decl_intern(cp,&local_6b0);
        if ((CVar3 >> 0x11 & 1) == 0) {
          CVar4 = lj_ctype_new(cp->cts,&local_6f0);
          pCVar14 = cp->cts->tab;
          uVar13 = pCVar14[ctypeid].info;
          pCVar9 = pCVar14 + ctypeid;
          if (local_6b0.bits == 0xffffffff) {
            bVar19 = false;
            if ((uVar13 & 0xf0000000) == 0x30000000) {
              bVar19 = pCVar9->size == 0xffffffff;
            }
            CVar10 = 0x7f;
            if (local_6b0.name != (GCstr *)0x0) goto LAB_0013bc00;
            if ((uVar13 & 0xf0000000) != 0x50000000 && (uVar13 & 0xf0100000) != 0x10000000) {
              cp_err_token(cp,0x100);
            }
            local_6f0->info = ctypeid + 0x80030000;
            uVar13 = local_6b0.attr | 0x80000000;
            if ((pCVar9->info & 0xf0000000) != 0x10000000) {
              uVar13 = 0;
            }
            local_6f0->size = uVar13;
          }
          else {
            if (((uVar13 & 0xf4000000) != 0) ||
               (((local_6b0.bits == 0 && (local_6b0.name != (GCstr *)0x0)) ||
                (uVar7 = pCVar9->size << 3, 0x20 < uVar7)))) {
LAB_0013bfe8:
              cp_errmsg(cp,0x3a,LJ_ERR_BADVAL);
            }
            if (0x7ffffff < uVar13) {
              uVar7 = 1;
            }
            bVar19 = false;
            CVar10 = local_6b0.bits;
            if (uVar7 < local_6b0.bits) goto LAB_0013bfe8;
LAB_0013bc00:
            local_6f0->info = ctypeid + CVar10 * 0x10000 + 0x90000000;
            local_6f0->size = local_6b0.attr;
            if (local_6b0.name != (GCstr *)0x0) {
              (local_6b0.name)->marked = (local_6b0.name)->marked | 0x20;
              (local_6f0->name).gcptr32 = (uint32_t)local_6b0.name;
            }
          }
          pCVar14[CVar16].sib = (CTypeID1)CVar4;
        }
        else {
          CVar4 = cp_decl_constinit(cp,&local_6f0,ctypeid);
          cp->cts->tab[CVar16].sib = (CTypeID1)CVar4;
          (local_6b0.name)->marked = (local_6b0.name)->marked | 0x20;
          (local_6f0->name).gcptr32 = (uint32_t)local_6b0.name;
          bVar19 = false;
        }
        if (cp->tok != 0x2c) goto LAB_0013bcdf;
        cp_next(cp);
        local_6b0.pos = local_6b0.specpos;
        local_6b0.top = local_6b0.specpos + 1;
        local_6b0.stack[local_6b0.specpos].next = 0;
        local_6b0.attr = local_6b0.specattr;
        local_6b0.fattr = local_6b0.specfattr;
        local_6b0.name = (GCstr *)0x0;
        local_6b0.redir = (GCstr *)0x0;
        CVar16 = CVar4;
      } while( true );
    }
LAB_0013bcf7:
    cp_check(cp,0x7d);
    cp->cts->tab[CVar4].sib = 0;
    cp_decl_attributes(cp,sdecl);
    local_6dc = sdecl->attr;
    local_6d4 = local_6dc >> 0x10 & 0xf;
    local_6c0 = cp->cts;
    pCVar14 = local_6c0->tab;
    uVar6 = (ulong)CVar2;
    local_6d0 = uVar6 * 0x10;
    local_6f8 = pCVar14[uVar6].info;
    uVar1 = pCVar14[uVar6].sib;
    if (uVar1 == 0) {
      local_6e8 = 0;
      uVar13 = 0;
    }
    else {
      uVar13 = 0;
      local_6e8 = 0;
      local_6c8 = pCVar14;
      do {
        local_6b8 = (ulong)uVar1;
        uVar18 = (uint)uVar1;
        uVar7 = pCVar14[uVar1].info;
        uVar8 = pCVar14[uVar1].size;
        if (((uVar7 & 0xf0000000) == 0x90000000) ||
           (uVar8 != 0 && (uVar7 & 0xf0ff0000) == 0x80030000)) {
          local_6d8 = uVar7 & 0xffff;
          CVar5 = lj_ctype_info(local_6c0,local_6d8,&local_6b0.top);
          if ((0x1fffffff < local_6b0.top) ||
             ((uVar18 = local_6b0.top * 8, ~uVar13 < uVar18 || ((CVar5 & 0x100000) != 0)))) {
            if ((local_6b0.top != 0xffffffff) ||
               (((CVar5 & 0xf0000000) != 0x30000000 || ((local_6f8 & 0x800000) != 0)))) {
              cp_err(cp,LJ_ERR_FFI_INVSIZE);
            }
            local_6b0.top = 0;
            uVar18 = 0;
          }
          if ((((uVar8 | local_6dc) & 2) != 0) ||
             ((uVar11 = CVar5 >> 0x10 & 0xf, (uVar8 & 1) != 0 && (uVar11 < (uVar8 >> 0x10 & 0xf)))))
          {
            uVar11 = uVar8 >> 0x10 & 0xf;
          }
          pCVar14 = local_6c8 + uVar1;
          uVar17 = (uint)cp->packstack[cp->curpack];
          if (uVar11 < cp->packstack[cp->curpack]) {
            uVar17 = uVar11;
          }
          if (local_6d4 < uVar17) {
            local_6d4 = uVar17;
          }
          iVar12 = 8 << ((byte)uVar17 & 0x1f);
          uVar11 = iVar12 - 1;
          uVar17 = uVar7 >> 0x10 & 0x7f;
          if ((uVar7 & 0xf0000000) == 0x90000000 && uVar17 != 0x7f) {
            if (((uVar8 & 1) != 0 || uVar17 == 0) ||
               ((((uVar8 | local_6dc) & 2) == 0 && (uVar18 < (uVar11 & uVar13) + uVar17)))) {
              uVar13 = -iVar12 & uVar13 + uVar11;
            }
            if ((uVar17 == uVar18) && ((uVar11 & uVar13) == 0)) {
              pCVar14->info = local_6d8 | 0x90000000;
              uVar18 = uVar17;
              uVar7 = uVar13;
            }
            else {
              pCVar14->info =
                   (uVar18 - 1 & uVar13) + (uVar17 << 8 | CVar5 & 0xb800000) + uVar18 * 0x2000 +
                   0xa0000000;
              uVar7 = -uVar18;
              uVar18 = uVar17;
              uVar7 = uVar7 & uVar13;
            }
          }
          else {
            uVar13 = -iVar12 & uVar11 + uVar13;
            uVar7 = uVar13;
          }
          uVar8 = (uint)local_6e8;
          if ((uint)local_6e8 < uVar18) {
            uVar8 = uVar18;
          }
          pCVar14->size = uVar7 >> 3;
          local_6e8 = local_6e8 & 0xffffffff;
          if ((local_6f8 >> 0x17 & 1) != 0) {
            local_6e8 = (ulong)uVar8;
            uVar18 = 0;
          }
          uVar13 = uVar13 + uVar18;
          uVar18 = (uint)local_6b8;
          pCVar14 = local_6c8;
          local_6f8 = CVar5 & 0x3100000 | local_6f8;
        }
        uVar1 = *(ushort *)((long)&pCVar14->sib + (ulong)(uVar18 << 4));
      } while (uVar1 != 0);
    }
    piVar15 = (int *)((long)&pCVar14->info + local_6d0);
    *piVar15 = local_6d4 * 0x10000 + local_6f8;
    uVar7 = (uint)local_6e8;
    if ((local_6f8 >> 0x17 & 1) == 0) {
      uVar7 = uVar13;
    }
    iVar12 = 8 << ((byte)local_6d4 & 0x1f);
    piVar15[1] = (-iVar12 & (iVar12 + uVar7) - 1) >> 3;
  }
  return CVar2;
LAB_0013bcdf:
  cp_check(cp,0x3b);
  if (cp->tok == 0x7d) goto LAB_0013bcf7;
  goto LAB_0013baab;
}

Assistant:

static CTypeID cp_decl_struct(CPState *cp, CPDecl *sdecl, CTInfo sinfo)
{
  CTypeID sid = cp_struct_name(cp, sdecl, sinfo);
  if (cp_opt(cp, '{')) {  /* Struct/union definition. */
    CTypeID lastid = sid;
    int lastdecl = 0;
    while (cp->tok != '}') {
      CPDecl decl;
      CPscl scl = cp_decl_spec(cp, &decl, CDF_STATIC);
      decl.mode = scl ? CPARSE_MODE_DIRECT :
	CPARSE_MODE_DIRECT|CPARSE_MODE_ABSTRACT|CPARSE_MODE_FIELD;

      for (;;) {
	CTypeID ctypeid;

	if (lastdecl) cp_err_token(cp, '}');

	/* Parse field declarator. */
	decl.bits = CTSIZE_INVALID;
	cp_declarator(cp, &decl);
	ctypeid = cp_decl_intern(cp, &decl);

	if ((scl & CDF_STATIC)) {  /* Static constant in struct namespace. */
	  CType *ct;
	  CTypeID fieldid = cp_decl_constinit(cp, &ct, ctypeid);
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	  ctype_setname(ct, decl.name);
	} else {
	  CTSize bsz = CTBSZ_FIELD;  /* Temp. for layout phase. */
	  CType *ct;
	  CTypeID fieldid = lj_ctype_new(cp->cts, &ct);  /* Do this first. */
	  CType *tct = ctype_raw(cp->cts, ctypeid);

	  if (decl.bits == CTSIZE_INVALID) {  /* Regular field. */
	    if (ctype_isarray(tct->info) && tct->size == CTSIZE_INVALID)
	      lastdecl = 1;  /* a[] or a[?] must be the last declared field. */

	    /* Accept transparent struct/union/enum. */
	    if (!decl.name) {
	      if (!((ctype_isstruct(tct->info) && !(tct->info & CTF_VLA)) ||
		    ctype_isenum(tct->info)))
		cp_err_token(cp, CTOK_IDENT);
	      ct->info = CTINFO(CT_ATTRIB, CTATTRIB(CTA_SUBTYPE) + ctypeid);
	      ct->size = ctype_isstruct(tct->info) ?
			 (decl.attr|0x80000000u) : 0;  /* For layout phase. */
	      goto add_field;
	    }
	  } else {  /* Bitfield. */
	    bsz = decl.bits;
	    if (!ctype_isinteger_or_bool(tct->info) ||
		(bsz == 0 && decl.name) || 8*tct->size > CTBSZ_MAX ||
		bsz > ((tct->info & CTF_BOOL) ? 1 : 8*tct->size))
	      cp_errmsg(cp, ':', LJ_ERR_BADVAL);
	  }

	  /* Create temporary field for layout phase. */
	  ct->info = CTINFO(CT_FIELD, ctypeid + (bsz << CTSHIFT_BITCSZ));
	  ct->size = decl.attr;
	  if (decl.name) ctype_setname(ct, decl.name);

	add_field:
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	}
	if (!cp_opt(cp, ',')) break;
	cp_decl_reset(&decl);
      }
      cp_check(cp, ';');
    }
    cp_check(cp, '}');
    ctype_get(cp->cts, lastid)->sib = 0;  /* Drop sib = 1 for empty structs. */
    cp_decl_attributes(cp, sdecl);  /* Layout phase needs postfix attributes. */
    cp_struct_layout(cp, sid, sdecl->attr);
  }
  return sid;
}